

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O0

void on_authentication_state_changed_callback
               (void *context,AUTHENTICATION_STATE previous_state,AUTHENTICATION_STATE new_state)

{
  LOGGER_LOG p_Var1;
  time_t tVar2;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 uVar3;
  LOGGER_LOG l_1;
  AMQP_DEVICE_INSTANCE_conflict *instance;
  LOGGER_LOG l;
  AUTHENTICATION_STATE new_state_local;
  AUTHENTICATION_STATE previous_state_local;
  void *context_local;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (context == (void *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                ,"on_authentication_state_changed_callback",0xd3,1,
                "on_authentication_state_changed_callback was invoked with new_state %d, but context is NULL"
                ,CONCAT44(uVar3,new_state));
    }
  }
  else if (new_state != previous_state) {
    *(AUTHENTICATION_STATE *)((long)context + 0x28) = new_state;
    tVar2 = get_time((time_t *)0x0);
    *(time_t *)((long)context + 0x30) = tVar2;
    if ((tVar2 == -1) && (p_Var1 = xlogging_get_log_function(), p_Var1 != (LOGGER_LOG)0x0)) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                ,"on_authentication_state_changed_callback",0xdc,1,
                "Device \'%s\' failed to set time of last authentication state change (get_time failed)"
                ,**context);
    }
  }
  return;
}

Assistant:

static void on_authentication_state_changed_callback(void* context, AUTHENTICATION_STATE previous_state, AUTHENTICATION_STATE new_state)
{
    if (context == NULL)
    {
        LogError("on_authentication_state_changed_callback was invoked with new_state %d, but context is NULL", new_state);
    }
    else if (new_state != previous_state)
    {
        AMQP_DEVICE_INSTANCE* instance = (AMQP_DEVICE_INSTANCE*)context;
        instance->auth_state = new_state;

        if ((instance->auth_state_last_changed_time = get_time(NULL)) == INDEFINITE_TIME)
        {
            LogError("Device '%s' failed to set time of last authentication state change (get_time failed)", instance->config->device_id);
        }
    }
}